

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void recharge(obj *obj,int curse_bless)

{
  char cVar1;
  obj *poVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  monst *pmVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong local_a0;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  long local_68;
  long loss;
  int lcnt;
  monst *shkp;
  obj *otmp;
  obj *curr;
  int chrg_1;
  int chrg;
  int rechrg;
  long mask;
  boolean is_on;
  int s;
  int lim;
  boolean is_blessed;
  boolean is_cursed;
  int n;
  int curse_bless_local;
  obj *obj_local;
  
  bVar12 = curse_bless < 0;
  bVar10 = curse_bless < 1;
  if (!bVar12) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffef | 0x10;
  }
  if (obj->oclass == '\v') {
    if (obj->spe == -1) {
      obj->spe = '\0';
    }
    uVar3 = *(uint *)&obj->field_0x4a >> 0x10 & 7;
    if ((uVar3 != 0) &&
       ((obj->otyp == 0x1c2 || (iVar4 = rn2(0x157), iVar4 < (int)(uVar3 * uVar3 * uVar3))))) {
      wand_explode(obj);
      return;
    }
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfff8ffff | (uVar3 + 1 & 7) << 0x10;
    if (bVar12) {
      stripspe(obj);
      return;
    }
    if (obj->otyp == 0x1c2) {
      local_70 = 3;
    }
    else {
      local_70 = 0xf;
      if ((*(ushort *)&objects[obj->otyp].field_0x11 >> 2 & 3) != 1) {
        local_70 = 8;
      }
    }
    if (local_70 == 3) {
      local_74 = 3;
    }
    else {
      local_74 = rn2(5);
      local_74 = local_74 + local_70 + -4;
    }
    lim = local_74;
    if (bVar10) {
      lim = rnd(local_74);
    }
    if (obj->spe < lim) {
      obj->spe = (schar)lim;
    }
    else {
      obj->spe = obj->spe + '\x01';
    }
    if ((obj->otyp == 0x1c2) && ('\x03' < obj->spe)) {
      wand_explode(obj);
      return;
    }
    if (local_70 <= obj->spe) {
      p_glow2(obj,"blue");
      return;
    }
    p_glow1(obj);
    return;
  }
  if ((obj->oclass == '\x04') && (((byte)objects[obj->otyp].field_0x10 >> 5 & 1) != 0)) {
    if (bVar10) {
      if (bVar12) {
        local_7c = rnd(2);
        local_7c = -local_7c;
      }
      else {
        local_7c = 1;
      }
      local_78 = local_7c;
    }
    else {
      local_78 = rnd(3);
    }
    bVar10 = obj == uleft;
    bVar11 = obj == uright;
    cVar1 = obj->spe;
    iVar4 = rn2(6);
    if (((int)cVar1 <= iVar4 + 3) && ((!bVar12 || (-5 < obj->spe)))) {
      if (bVar10 || bVar11) {
        uVar3 = 0x40000;
        if (obj == uleft) {
          uVar3 = 0x20000;
        }
        local_a0 = (ulong)uVar3;
      }
      else {
        local_a0 = 0;
      }
      pcVar5 = xname(obj);
      pcVar6 = "";
      if (local_78 < 0) {
        pcVar6 = "counter";
      }
      pline("Your %s spins %sclockwise for a moment.",pcVar5,pcVar6);
      if (bVar10 || bVar11) {
        Ring_off(obj);
      }
      obj->spe = obj->spe + (char)local_78;
      if (!bVar10 && !bVar11) {
        return;
      }
      setworn(obj,local_a0);
      Ring_on(obj,'\0');
      return;
    }
    pcVar5 = xname(obj);
    pcVar6 = otense(obj,"pulsate");
    pcVar7 = otense(obj,"explode");
    pline("Your %s %s momentarily, then %s!",pcVar5,pcVar6,pcVar7);
    if (bVar10 || bVar11) {
      Ring_gone(obj);
    }
    iVar4 = (int)obj->spe;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    iVar4 = rnd(iVar4 * 3);
    useup(obj);
    losehp(iVar4,"exploding ring",0);
    return;
  }
  if (obj->oclass == '\x06') {
    uVar3 = *(uint *)&obj->field_0x4a >> 0x10 & 7;
    if (uVar3 < 7) {
      *(uint *)&obj->field_0x4a =
           *(uint *)&obj->field_0x4a & 0xfff8ffff |
           ((*(uint *)&obj->field_0x4a >> 0x10 & 7) + 1 & 7) << 0x10;
    }
    switch(obj->otyp) {
    case 0xe1:
      if (!bVar12) {
        loss._4_4_ = 0;
        local_68 = 0;
        discover_object(0xe1,'\x01','\x01');
        otmp = obj->cobj;
        while (otmp != (obj *)0x0) {
          poVar2 = otmp->nobj;
          obj_extract_self(otmp);
          loss._4_4_ = loss._4_4_ + 1;
          if (((u.ushops[0] != '\0') &&
              (pmVar8 = shop_keeper(level,u.ushops[0]), pmVar8 != (monst *)0x0)) &&
             ((*(uint *)&otmp->field_0x4a >> 2 & 1) != 0)) {
            lVar9 = stolen_value(otmp,u.ux,u.uy,(byte)(*(uint *)&pmVar8->field_0x60 >> 0x16) & 1,
                                 '\x01');
            local_68 = lVar9 + local_68;
          }
          obfree(otmp,(obj *)0x0);
          otmp = poVar2;
        }
        if (loss._4_4_ != 0) {
          pcVar5 = yname(obj);
          You_hear("loud crunching sounds from inside %s.",pcVar5);
          if (local_68 != 0) {
            pcVar5 = currency(local_68);
            pcVar6 = "";
            if (1 < loss._4_4_) {
              pcVar6 = "s";
            }
            pline("You owe %ld %s for lost item%s.",local_68,pcVar5,pcVar6);
          }
        }
      }
    case 0xf5:
    case 0x101:
      if (bVar12) {
        stripspe(obj);
      }
      else if (bVar10) {
        iVar4 = rnd(5);
        obj->spe = obj->spe + (char)iVar4;
        if ('2' < obj->spe) {
          obj->spe = '2';
        }
        p_glow1(obj);
      }
      else {
        if (obj->spe < '\v') {
          iVar4 = rn2(10);
          obj->spe = obj->spe + (char)iVar4 + '\x06';
        }
        else {
          iVar4 = rn2(5);
          obj->spe = obj->spe + (char)iVar4 + '\x06';
        }
        if ('2' < obj->spe) {
          obj->spe = '2';
        }
        p_glow2(obj,"blue");
      }
      break;
    default:
      goto LAB_002b5ac5;
    case 0xe7:
    case 0xe8:
      if (bVar12) {
        stripspe(obj);
        if ((*(uint *)&obj->field_0x4a >> 0x13 & 1) != 0) {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pcVar5 = Tobjnam(obj,"go");
            pline("%s out!",pcVar5);
          }
          end_burn(obj,'\x01');
        }
      }
      else if (bVar10) {
        obj->spe = '\x01';
        obj->age = obj->age + 0x2ee;
        if (0x5dc < obj->age) {
          obj->age = 0x5dc;
        }
        p_glow1(obj);
      }
      else {
        obj->spe = '\x01';
        obj->age = 0x5dc;
        p_glow2(obj,"blue");
      }
      break;
    case 0xea:
    case 0xf3:
    case 0xf7:
      if (bVar12) {
        stripspe(obj);
      }
      else if ((uVar3 == 0) || (obj->otyp != 0xf7)) {
        if (bVar10) {
          iVar4 = rn2(0xb);
          iVar4 = iVar4 + 10;
          if (obj->spe + iVar4 < 0x33) {
            obj->spe = '2';
          }
          else if (obj->spe + iVar4 < 0x80) {
            obj->spe = obj->spe + (char)iVar4;
          }
          else {
            obj->spe = '\x7f';
          }
          p_glow2(obj,"white");
        }
        else {
          iVar4 = rn2(0x10);
          iVar4 = iVar4 + 0xf;
          if (obj->spe + iVar4 < 0x33) {
            obj->spe = '2';
          }
          else if (obj->spe + iVar4 < 0x4c) {
            obj->spe = 'K';
          }
          else if (obj->spe + iVar4 < 0x80) {
            obj->spe = obj->spe + (char)iVar4;
          }
          else {
            obj->spe = '\x7f';
          }
          p_glow2(obj,"blue");
        }
      }
      else {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfff8ffff | 0x10000;
        if (obj->spe < '\x03') {
          pline("Your marker seems permanently dried out.");
        }
        else {
          pline("Nothing happens.");
        }
      }
      break;
    case 0xec:
      if (bVar12) {
        stripspe(obj);
      }
      else if (bVar10) {
        if (obj->spe < '\x05') {
          obj->spe = obj->spe + '\x01';
          p_glow1(obj);
        }
        else {
          pline("Nothing happens.");
        }
      }
      else {
        obj->spe = '\x06';
        p_glow2(obj,"blue");
      }
      break;
    case 0xfd:
    case 0xff:
    case 0x100:
    case 0x103:
    case 0x107:
      if (bVar12) {
        stripspe(obj);
      }
      else if (bVar10) {
        iVar4 = rnd(4);
        obj->spe = obj->spe + (char)iVar4;
        if ('\x14' < obj->spe) {
          obj->spe = '\x14';
        }
        p_glow1(obj);
      }
      else {
        iVar4 = dice(2,4);
        obj->spe = obj->spe + (char)iVar4;
        if ('\x14' < obj->spe) {
          obj->spe = '\x14';
        }
        p_glow2(obj,"blue");
      }
      break;
    case 0x10c:
      if (bVar12) {
        stripspe(obj);
      }
      else if (bVar10) {
        obj->spe = obj->spe + '\x01';
      }
      else {
        iVar4 = rnd(3);
        obj->spe = obj->spe + (char)iVar4;
      }
      if ('\x05' < obj->spe) {
        obj->spe = '\x05';
      }
    }
  }
  else {
LAB_002b5ac5:
    pline("You have a feeling of loss.");
  }
  return;
}

Assistant:

void recharge(struct obj *obj, int curse_bless)
{
	int n;
	boolean is_cursed, is_blessed;

	is_cursed = curse_bless < 0;
	is_blessed = curse_bless > 0;

	/* Scrolls of charging now ID charge count, as well as doing
	 * the charging, unless cursed. */
	if (!is_cursed) obj->known = 1;

	if (obj->oclass == WAND_CLASS) {
	    /* undo any prior cancellation, even when is_cursed */
	    if (obj->spe == -1) obj->spe = 0;

	    /*
	     * Recharging might cause wands to explode.
	     *	v = number of previous recharges
	     *	      v = percentage chance to explode on this attempt
	     *		      v = cumulative odds for exploding
	     *	0 :   0       0
	     *	1 :   0.29    0.29
	     *	2 :   2.33    2.62
	     *	3 :   7.87   10.28
	     *	4 :  18.66   27.02
	     *	5 :  36.44   53.62
	     *	6 :  62.97   82.83
	     *	7 : 100     100
	     */
	    n = (int)obj->recharged;
	    if (n > 0 && (obj->otyp == WAN_WISHING ||
		    (n * n * n > rn2(7*7*7)))) {	/* recharge_limit */
		wand_explode(obj);
		return;
	    }
	    /* didn't explode, so increment the recharge count */
	    obj->recharged = (unsigned)(n + 1);

	    /* now handle the actual recharging */
	    if (is_cursed) {
		stripspe(obj);
	    } else {
		int lim = (obj->otyp == WAN_WISHING) ? 3 :
			(objects[obj->otyp].oc_dir != NODIR) ? 8 : 15;

		n = (lim == 3) ? 3 : rn1(5, lim + 1 - 5);
		if (!is_blessed) n = rnd(n);

		if (obj->spe < n) obj->spe = n;
		else obj->spe++;
		if (obj->otyp == WAN_WISHING && obj->spe > 3) {
		    wand_explode(obj);
		    return;
		}
		if (obj->spe >= lim) p_glow2(obj, "blue");
		else p_glow1(obj);
	    }

	} else if (obj->oclass == RING_CLASS &&
					objects[obj->otyp].oc_charged) {
	    /* charging does not affect ring's curse/bless status */
	    int s = is_blessed ? rnd(3) : is_cursed ? -rnd(2) : 1;
	    boolean is_on = (obj == uleft || obj == uright);

	    /* destruction depends on current state, not adjustment */
	    if (obj->spe > rn2(6) + 3 || (is_cursed && obj->spe <= -5)) {
		pline("Your %s %s momentarily, then %s!",
		     xname(obj), otense(obj,"pulsate"), otense(obj,"explode"));
		if (is_on) Ring_gone(obj);
		s = rnd(3 * abs(obj->spe));	/* amount of damage */
		useup(obj);
		losehp(s, "exploding ring", KILLED_BY_AN);
	    } else {
		long mask = is_on ? (obj == uleft ? LEFT_RING :
				     RIGHT_RING) : 0L;
		pline("Your %s spins %sclockwise for a moment.",
		     xname(obj), s < 0 ? "counter" : "");
		/* cause attributes and/or properties to be updated */
		if (is_on) Ring_off(obj);
		obj->spe += s;	/* update the ring while it's off */
		if (is_on) setworn(obj, mask), Ring_on(obj, FALSE);
		/* oartifact: if a touch-sensitive artifact ring is
		   ever created the above will need to be revised  */
	    }

	} else if (obj->oclass == TOOL_CLASS) {
	    int rechrg = (int)obj->recharged;

	    /* tools don't have a limit, but the counter used does */
	    if (rechrg < 7)	/* recharge_limit */
		obj->recharged++;

	    switch(obj->otyp) {
	    case BELL_OF_OPENING:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) obj->spe += rnd(3);
		else obj->spe += 1;
		if (obj->spe > 5) obj->spe = 5;
		break;
	    case MAGIC_MARKER:
	    case TINNING_KIT:
	    case EXPENSIVE_CAMERA:
		if (is_cursed) stripspe(obj);
		else if (rechrg && obj->otyp == MAGIC_MARKER) {	/* previously recharged */
		    obj->recharged = 1;	/* override increment done above */
		    if (obj->spe < 3)
			pline("Your marker seems permanently dried out.");
		    else
			pline("Nothing happens.");
		} else if (is_blessed) {
		    n = rn1(16,15);		/* 15..30 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else if (obj->spe + n <= 75)
			obj->spe = 75;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "blue");
		} else {
		    n = rn1(11,10);		/* 10..20 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "white");
		}
		break;
	    case OIL_LAMP:
	    case BRASS_LANTERN:
		if (is_cursed) {
		    stripspe(obj);
		    if (obj->lamplit) {
			if (!Blind)
			    pline("%s out!", Tobjnam(obj, "go"));
			end_burn(obj, TRUE);
		    }
		} else if (is_blessed) {
		    obj->spe = 1;
		    obj->age = 1500;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe = 1;
		    obj->age += 750;
		    if (obj->age > 1500) obj->age = 1500;
		    p_glow1(obj);
		}
		break;
	    case CRYSTAL_BALL:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    obj->spe = 6;
		    p_glow2(obj, "blue");
		} else {
		    if (obj->spe < 5) {
			obj->spe++;
			p_glow1(obj);
		    } else pline("Nothing happens.");
		}
		break;
	    case BAG_OF_TRICKS:
		/* if there are any objects inside the bag, devour them */
		if (!is_cursed) {
		    struct obj *curr, *otmp;
		    struct monst *shkp;
		    int lcnt = 0;
		    long loss = 0L;

		    makeknown(BAG_OF_TRICKS);
		    for (curr = obj->cobj; curr; curr = otmp) {
			otmp = curr->nobj;
			obj_extract_self(curr);
			lcnt++;
			if (*u.ushops && (shkp = shop_keeper(level, *u.ushops)) != 0) {
			    if (curr->unpaid)
				loss += stolen_value(curr, u.ux, u.uy,
						     (boolean)shkp->mpeaceful, TRUE);
			}
			/* obfree() will free all contained objects */
			obfree(curr, NULL);
		    }

		    if (lcnt)
			You_hear("loud crunching sounds from inside %s.", yname(obj));
		    if (lcnt && loss)
			pline("You owe %ld %s for lost item%s.",
			      loss, currency(loss), lcnt > 1 ? "s" : "");
		}
		/* fall through */
	    case HORN_OF_PLENTY:
	    case CAN_OF_GREASE:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    if (obj->spe <= 10)
			obj->spe += rn1(10, 6);
		    else obj->spe += rn1(5, 6);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(5);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow1(obj);
		}
		break;
	    case MAGIC_FLUTE:
	    case MAGIC_HARP:
	    case FROST_HORN:
	    case FIRE_HORN:
	    case DRUM_OF_EARTHQUAKE:
		if (is_cursed) {
		    stripspe(obj);
		} else if (is_blessed) {
		    obj->spe += dice(2,4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow1(obj);
		}
		break;
	    default:
		goto not_chargable;
		/*NOTREACHED*/
		break;
	    } /* switch */

	} else {
 not_chargable:
	    pline("You have a feeling of loss.");
	}
}